

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O2

tlc_linecount_t
TURBOLINECOUNT::CLineCount::LineCount(TCHAR *filename,tlc_error_t *error,tlc_string_t *errorstring)

{
  bool bVar1;
  int iVar2;
  int __oflag;
  tlc_linecount_t tVar3;
  tlc_linecount_t count;
  string local_c8 [32];
  CLineCount lc;
  
  CLineCount(&lc,(PARAMETERS *)0x0);
  iVar2 = open(&lc,filename,__oflag);
  if ((char)iVar2 == '\0') {
    if (error != (tlc_error_t *)0x0) {
      *error = lc.m_lasterror;
    }
    tVar3 = -1;
    if (errorstring == (tlc_string_t *)0x0) goto LAB_001041c4;
    std::__cxx11::string::string(local_c8,(string *)&lc.m_lasterrorstring);
  }
  else {
    bVar1 = countLines(&lc,&count);
    if (bVar1) {
      *error = 0;
      std::__cxx11::string::assign((char *)errorstring);
      tVar3 = count;
      goto LAB_001041c4;
    }
    if (error != (tlc_error_t *)0x0) {
      *error = lc.m_lasterror;
    }
    tVar3 = -1;
    if (errorstring == (tlc_string_t *)0x0) goto LAB_001041c4;
    std::__cxx11::string::string(local_c8,(string *)&lc.m_lasterrorstring);
  }
  tVar3 = -1;
  std::__cxx11::string::operator=((string *)errorstring,local_c8);
  std::__cxx11::string::~string(local_c8);
LAB_001041c4:
  ~CLineCount(&lc);
  return tVar3;
}

Assistant:

tlc_linecount_t CLineCount::LineCount(const TCHAR *filename, tlc_error_t * error, tlc_string_t *errorstring)
{
	CLineCount lc;
	if (!lc.open(filename))
	{
		if (error)
		{
			*error = lc.lastError();
		}
		if (errorstring)
		{
			*errorstring = lc.lastErrorString();
		}

		return -1;
	}

	tlc_linecount_t count;
	if (!lc.countLines(count))
	{
		if (error)
		{
			*error = lc.lastError();
		}
		if (errorstring)
		{
			*errorstring = lc.lastErrorString();
		}
		return -1;
	}

	*error = 0;
	*errorstring = _T("");

	return count;
}